

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTileDescriptionAttribute.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::TileDescription>::readValueFrom
          (TypedAttribute<Imf_3_4::TileDescription> *this,IStream *is,int size,int version)

{
  byte bVar1;
  undefined4 in_register_0000000c;
  ulong uVar2;
  uchar tmp;
  uchar b [4];
  uchar b_1 [4];
  byte local_21;
  uint local_20;
  uint local_1c;
  
  (*is->_vptr_IStream[3])(is,&local_20,4,CONCAT44(in_register_0000000c,version));
  (this->_value).xSize = local_20;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).ySize = local_1c;
  (*is->_vptr_IStream[3])(is,&local_21,1);
  bVar1 = local_21 >> 4;
  local_21 = local_21 & 0xf;
  uVar2 = (ulong)CONCAT14((2 < bVar1) * '\x02' | (2 >= bVar1) * bVar1,
                          (uint)(byte)((3 < local_21) * '\x03' | (3 >= local_21) * local_21));
  (this->_value).mode = (int)uVar2;
  (this->_value).roundingMode = (int)(uVar2 >> 0x20);
  return;
}

Assistant:

IMF_EXPORT void
TileDescriptionAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    Xdr::read<StreamIO> (is, _value.xSize);
    Xdr::read<StreamIO> (is, _value.ySize);

    unsigned char tmp;
    Xdr::read<StreamIO> (is, tmp);

    //
    // four bits are allocated for 'mode' for future use (16 possible values)
    // but only values 0,1,2 are currently valid. '3' is a special valid enum value
    // that indicates bad values have been used
    //
    // roundingMode can only be 0 or 1, and 2 is a special enum value for 'bad enum'
    //
    unsigned char levelMode = tmp & 0x0f;
    if (levelMode > 3) { levelMode = 3; }

    _value.mode = LevelMode (levelMode);

    unsigned char levelRoundingMode = (tmp >> 4) & 0x0f;
    if (levelRoundingMode > 2) { levelRoundingMode = 2; }

    _value.roundingMode = LevelRoundingMode (levelRoundingMode);
}